

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf_weights.cc
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  basic_option<char> *pbVar4;
  undefined8 uVar5;
  size_type sVar6;
  int iVar7;
  char *pcVar8;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar9;
  const_iterator cVar10;
  vw *all;
  long lVar11;
  long *plVar12;
  undefined8 *puVar13;
  __ssize_t _Var14;
  size_t sVar15;
  example *peVar16;
  ostream *poVar17;
  _func_int **pp_Var18;
  ulong uVar19;
  ulong uVar20;
  _func_int *p_Var21;
  ulong uVar22;
  string outdir;
  string vwparams;
  string target;
  char *line;
  string infile;
  size_t len;
  options_description desc;
  ofstream right_quadratic;
  ofstream right_linear;
  ofstream left_quadratic;
  variables_map vm;
  ofstream left_linear;
  ofstream constant;
  _func_int **local_d08;
  long local_d00;
  _func_int *local_cf8;
  undefined8 uStack_cf0;
  _func_int **local_ce8;
  long local_ce0;
  _func_int *local_cd8;
  undefined8 uStack_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  _func_int **local_ca8;
  long local_ca0;
  _func_int *local_c98;
  long lStack_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  example *local_c68;
  undefined1 *local_c60;
  long local_c58;
  undefined1 local_c50 [16];
  long local_c40;
  _func_int **local_c38;
  long local_c30;
  _func_int *local_c28 [2];
  char *local_c18;
  _func_int **local_c10;
  long local_c08;
  _func_int *local_c00 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  FILE *local_bd0;
  long local_bc8;
  _func_int **local_bc0;
  long local_bb8;
  _func_int *local_bb0 [2];
  size_t local_ba0;
  string local_b98;
  undefined1 *local_b78 [2];
  undefined1 local_b68 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_b50 [24];
  void *local_b38;
  undefined4 local_b30;
  undefined8 local_b28;
  undefined4 local_b20;
  undefined8 local_b18;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_b10 [24];
  undefined1 local_af8 [8];
  long local_af0;
  _func_int *local_ae8 [29];
  ios_base aiStack_a00 [264];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_8f8;
  undefined1 local_8d0 [8];
  long local_8c8;
  _func_int *local_8c0 [29];
  ios_base aiStack_7d8 [264];
  undefined1 local_6d0 [8];
  long local_6c8;
  _func_int *local_6c0;
  long lStack_6b8;
  ios_base aiStack_5d8 [264];
  code *local_4d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_4c0 [8];
  _Rb_tree_node_base local_4b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_490;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_460;
  undefined1 local_430 [16];
  _func_int *local_420 [29];
  ios_base aiStack_338 [264];
  undefined1 local_230 [16];
  basic_option<char> local_220 [2];
  ios_base aiStack_138 [264];
  
  local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
  local_bf0._M_string_length = 0;
  local_bf0.field_2._M_local_buf[0] = '\0';
  local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,".","");
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  local_c88._M_string_length = 0;
  local_c88.field_2._M_local_buf[0] = '\0';
  boost::program_options::variables_map::variables_map((variables_map *)local_4d0);
  local_230._0_8_ = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_b78,(string *)local_230,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((basic_option<char> *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_);
  }
  local_230._0_8_ = boost::program_options::options_description::add_options();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_230,"help,h");
  ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_bf0);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"infile,I",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_cc8);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"outdir,O",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>(&local_c88);
  boost::program_options::options_description_easy_init::operator()
            (pcVar8,(value_semantic *)"vwparams",(char *)ptVar9);
  local_8f8.super_function_base.vtable = (vtable_base *)0x0;
  local_8f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_8f8.super_function_base.functor._8_8_ = 0;
  local_8f8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_230,argc,argv,(options_description *)local_b78,0,
             &local_8f8);
  boost::program_options::store((basic_parsed_options *)local_230,(variables_map *)local_4d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_230);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_8f8);
  boost::program_options::notify((variables_map *)local_4d0);
  local_230._0_8_ = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"help","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_4c0,(key_type *)local_230);
  sVar6 = local_c88._M_string_length;
  if ((cVar10._M_node == &local_4b8) && (local_bf0._M_string_length != 0)) {
    if ((basic_option<char> *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_);
    }
    if (sVar6 != 0) {
      local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b98,local_c88._M_dataplus._M_p,
                 local_c88._M_dataplus._M_p + local_c88._M_string_length);
      all = VW::initialize(&local_b98,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
        operator_delete(local_b98._M_dataplus._M_p);
      }
      all->audit = true;
      local_c60 = local_c50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c60,"--rank ","");
      lVar11 = std::__cxx11::string::find((char *)&local_c88,(ulong)local_c60,0);
      iVar7 = atoi(local_c88._M_dataplus._M_p + local_c58 + lVar11);
      pbVar2 = (byte *)(((all->pairs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      bVar1 = *pbVar2;
      local_c68 = (example *)(ulong)pbVar2[1];
      local_bd0 = fopen64(local_bf0._M_dataplus._M_p,"r");
      local_c18 = (char *)0x0;
      local_ba0 = 0;
      local_8d0 = (undefined1  [8])local_8c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"/","");
      local_c40 = CONCAT44(local_c40._4_4_,iVar7);
      plVar12 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_8d0,0,(char *)0x0,(ulong)local_cc8._M_dataplus._M_p)
      ;
      pp_Var18 = (_func_int **)(plVar12 + 2);
      if ((_func_int **)*plVar12 == pp_Var18) {
        local_6c0 = *pp_Var18;
        lStack_6b8 = plVar12[3];
        local_6d0 = (undefined1  [8])&local_6c0;
      }
      else {
        local_6c0 = *pp_Var18;
        local_6d0 = (undefined1  [8])*plVar12;
      }
      local_6c8 = plVar12[1];
      *plVar12 = (long)pp_Var18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_af8 = (undefined1  [8])local_ae8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_af8,"constant","");
      p_Var21 = (_func_int *)0xf;
      if (local_6d0 != (undefined1  [8])&local_6c0) {
        p_Var21 = local_6c0;
      }
      if (p_Var21 < (_func_int *)(local_af0 + local_6c8)) {
        p_Var21 = (_func_int *)0xf;
        if (local_af8 != (undefined1  [8])local_ae8) {
          p_Var21 = local_ae8[0];
        }
        if (p_Var21 < (_func_int *)(local_af0 + local_6c8)) goto LAB_001194c9;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_af8,0,(char *)0x0,(ulong)local_6d0);
      }
      else {
LAB_001194c9:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_6d0,(ulong)local_af8);
      }
      local_430._0_8_ = local_420;
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_420[0] = *pp_Var18;
        local_420[1] = (_func_int *)puVar13[3];
      }
      else {
        local_420[0] = *pp_Var18;
        local_430._0_8_ = (_func_int **)*puVar13;
      }
      local_430._8_8_ = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)pp_Var18 = 0;
      std::ofstream::ofstream(local_230,(char *)local_430._0_8_,_S_out);
      if ((_func_int **)local_430._0_8_ != local_420) {
        operator_delete((void *)local_430._0_8_);
      }
      if (local_af8 != (undefined1  [8])local_ae8) {
        operator_delete((void *)local_af8);
      }
      if (local_6d0 != (undefined1  [8])&local_6c0) {
        operator_delete((void *)local_6d0);
      }
      if (local_8d0 != (undefined1  [8])local_8c0) {
        operator_delete((void *)local_8d0);
      }
      local_ce8 = &local_cd8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce8,"/","");
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_ce8,0,(char *)0x0,(ulong)local_cc8._M_dataplus._M_p);
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_ae8[0] = *pp_Var18;
        local_ae8[1] = (_func_int *)puVar13[3];
        local_af8 = (undefined1  [8])local_ae8;
      }
      else {
        local_ae8[0] = *pp_Var18;
        local_af8 = (undefined1  [8])*puVar13;
      }
      local_af0 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      local_d08 = &local_cf8;
      std::__cxx11::string::_M_construct((ulong)&local_d08,'\x01');
      p_Var21 = (_func_int *)0xf;
      if (local_af8 != (undefined1  [8])local_ae8) {
        p_Var21 = local_ae8[0];
      }
      if (p_Var21 < (_func_int *)(local_d00 + local_af0)) {
        p_Var21 = (_func_int *)0xf;
        if (local_d08 != &local_cf8) {
          p_Var21 = local_cf8;
        }
        if (p_Var21 < (_func_int *)(local_d00 + local_af0)) goto LAB_00119693;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_d08,0,(char *)0x0,(ulong)local_af8);
      }
      else {
LAB_00119693:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_af8,(ulong)local_d08);
      }
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_8c0[0] = *pp_Var18;
        local_8c0[1] = (_func_int *)puVar13[3];
        local_8d0 = (undefined1  [8])local_8c0;
      }
      else {
        local_8c0[0] = *pp_Var18;
        local_8d0 = (undefined1  [8])*puVar13;
      }
      local_8c8 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)pp_Var18 = 0;
      local_ca8 = &local_c98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,".linear","");
      p_Var21 = (_func_int *)0xf;
      if (local_8d0 != (undefined1  [8])local_8c0) {
        p_Var21 = local_8c0[0];
      }
      if (p_Var21 < (_func_int *)(local_ca0 + local_8c8)) {
        p_Var21 = (_func_int *)0xf;
        if (local_ca8 != &local_c98) {
          p_Var21 = local_c98;
        }
        if (p_Var21 < (_func_int *)(local_ca0 + local_8c8)) goto LAB_00119778;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_ca8,0,(char *)0x0,(ulong)local_8d0);
      }
      else {
LAB_00119778:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_8d0,(ulong)local_ca8);
      }
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_6c0 = *pp_Var18;
        lStack_6b8 = puVar13[3];
        local_6d0 = (undefined1  [8])&local_6c0;
      }
      else {
        local_6c0 = *pp_Var18;
        local_6d0 = (undefined1  [8])*puVar13;
      }
      local_6c8 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)pp_Var18 = 0;
      std::ofstream::ofstream(local_430,(char *)local_6d0,_S_out);
      if (local_6d0 != (undefined1  [8])&local_6c0) {
        operator_delete((void *)local_6d0);
      }
      if (local_ca8 != &local_c98) {
        operator_delete(local_ca8);
      }
      if (local_8d0 != (undefined1  [8])local_8c0) {
        operator_delete((void *)local_8d0);
      }
      if (local_d08 != &local_cf8) {
        operator_delete(local_d08);
      }
      if (local_af8 != (undefined1  [8])local_ae8) {
        operator_delete((void *)local_af8);
      }
      if (local_ce8 != &local_cd8) {
        operator_delete(local_ce8);
      }
      local_d08 = &local_cf8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d08,"/","");
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_d08,0,(char *)0x0,(ulong)local_cc8._M_dataplus._M_p);
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_cd8 = *pp_Var18;
        uStack_cd0 = puVar13[3];
        local_ce8 = &local_cd8;
      }
      else {
        local_cd8 = *pp_Var18;
        local_ce8 = (_func_int **)*puVar13;
      }
      local_ce0 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      local_ca8 = &local_c98;
      std::__cxx11::string::_M_construct((ulong)&local_ca8,'\x01');
      p_Var21 = (_func_int *)0xf;
      if (local_ce8 != &local_cd8) {
        p_Var21 = local_cd8;
      }
      if (p_Var21 < (_func_int *)(local_ca0 + local_ce0)) {
        p_Var21 = (_func_int *)0xf;
        if (local_ca8 != &local_c98) {
          p_Var21 = local_c98;
        }
        if (p_Var21 < (_func_int *)(local_ca0 + local_ce0)) goto LAB_00119944;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_ca8,0,(char *)0x0,(ulong)local_ce8);
      }
      else {
LAB_00119944:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ce8,(ulong)local_ca8)
        ;
      }
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_ae8[0] = *pp_Var18;
        local_ae8[1] = (_func_int *)puVar13[3];
        local_af8 = (undefined1  [8])local_ae8;
      }
      else {
        local_ae8[0] = *pp_Var18;
        local_af8 = (undefined1  [8])*puVar13;
      }
      local_af0 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)pp_Var18 = 0;
      local_c38 = local_c28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c38,".quadratic","");
      p_Var21 = (_func_int *)0xf;
      if (local_af8 != (undefined1  [8])local_ae8) {
        p_Var21 = local_ae8[0];
      }
      if (p_Var21 < (_func_int *)(local_c30 + local_af0)) {
        p_Var21 = (_func_int *)0xf;
        if (local_c38 != local_c28) {
          p_Var21 = local_c28[0];
        }
        if (p_Var21 < (_func_int *)(local_c30 + local_af0)) goto LAB_00119a29;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_c38,0,(char *)0x0,(ulong)local_af8);
      }
      else {
LAB_00119a29:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_af8,(ulong)local_c38);
      }
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_8c0[0] = *pp_Var18;
        local_8c0[1] = (_func_int *)puVar13[3];
        local_8d0 = (undefined1  [8])local_8c0;
      }
      else {
        local_8c0[0] = *pp_Var18;
        local_8d0 = (undefined1  [8])*puVar13;
      }
      local_8c8 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)pp_Var18 = 0;
      std::ofstream::ofstream(local_6d0,(char *)local_8d0,_S_out);
      if (local_8d0 != (undefined1  [8])local_8c0) {
        operator_delete((void *)local_8d0);
      }
      if (local_c38 != local_c28) {
        operator_delete(local_c38);
      }
      if (local_af8 != (undefined1  [8])local_ae8) {
        operator_delete((void *)local_af8);
      }
      if (local_ca8 != &local_c98) {
        operator_delete(local_ca8);
      }
      if (local_ce8 != &local_cd8) {
        operator_delete(local_ce8);
      }
      if (local_d08 != &local_cf8) {
        operator_delete(local_d08);
      }
      local_ca8 = &local_c98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"/","");
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_ca8,0,(char *)0x0,(ulong)local_cc8._M_dataplus._M_p);
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_cf8 = *pp_Var18;
        uStack_cf0 = puVar13[3];
        local_d08 = &local_cf8;
      }
      else {
        local_cf8 = *pp_Var18;
        local_d08 = (_func_int **)*puVar13;
      }
      local_d00 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      local_c38 = local_c28;
      std::__cxx11::string::_M_construct((ulong)&local_c38,'\x01');
      p_Var21 = (_func_int *)0xf;
      if (local_d08 != &local_cf8) {
        p_Var21 = local_cf8;
      }
      if (p_Var21 < (_func_int *)(local_c30 + local_d00)) {
        p_Var21 = (_func_int *)0xf;
        if (local_c38 != local_c28) {
          p_Var21 = local_c28[0];
        }
        if (p_Var21 < (_func_int *)(local_c30 + local_d00)) goto LAB_00119bf6;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_c38,0,(char *)0x0,(ulong)local_d08);
      }
      else {
LAB_00119bf6:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d08,(ulong)local_c38)
        ;
      }
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_cd8 = *pp_Var18;
        uStack_cd0 = puVar13[3];
        local_ce8 = &local_cd8;
      }
      else {
        local_cd8 = *pp_Var18;
        local_ce8 = (_func_int **)*puVar13;
      }
      local_ce0 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)pp_Var18 = 0;
      local_c10 = local_c00;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,".linear","");
      p_Var21 = (_func_int *)0xf;
      if (local_ce8 != &local_cd8) {
        p_Var21 = local_cd8;
      }
      if (p_Var21 < (_func_int *)(local_c08 + local_ce0)) {
        p_Var21 = (_func_int *)0xf;
        if (local_c10 != local_c00) {
          p_Var21 = local_c00[0];
        }
        if (p_Var21 < (_func_int *)(local_c08 + local_ce0)) goto LAB_00119cc8;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_c10,0,(char *)0x0,(ulong)local_ce8);
      }
      else {
LAB_00119cc8:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ce8,(ulong)local_c10)
        ;
      }
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_ae8[0] = *pp_Var18;
        local_ae8[1] = (_func_int *)puVar13[3];
        local_af8 = (undefined1  [8])local_ae8;
      }
      else {
        local_ae8[0] = *pp_Var18;
        local_af8 = (undefined1  [8])*puVar13;
      }
      local_af0 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)pp_Var18 = 0;
      std::ofstream::ofstream(local_8d0,(char *)local_af8,_S_out);
      if (local_af8 != (undefined1  [8])local_ae8) {
        operator_delete((void *)local_af8);
      }
      if (local_c10 != local_c00) {
        operator_delete(local_c10);
      }
      if (local_ce8 != &local_cd8) {
        operator_delete(local_ce8);
      }
      if (local_c38 != local_c28) {
        operator_delete(local_c38);
      }
      if (local_d08 != &local_cf8) {
        operator_delete(local_d08);
      }
      if (local_ca8 != &local_c98) {
        operator_delete(local_ca8);
      }
      local_c38 = local_c28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c38,"/","");
      plVar12 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_c38,0,(char *)0x0,(ulong)local_cc8._M_dataplus._M_p
                                  );
      local_ca8 = &local_c98;
      pp_Var18 = (_func_int **)(plVar12 + 2);
      if ((_func_int **)*plVar12 == pp_Var18) {
        local_c98 = *pp_Var18;
        lStack_c90 = plVar12[3];
      }
      else {
        local_c98 = *pp_Var18;
        local_ca8 = (_func_int **)*plVar12;
      }
      local_ca0 = plVar12[1];
      *plVar12 = (long)pp_Var18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_c10 = local_c00;
      std::__cxx11::string::_M_construct((ulong)&local_c10,'\x01');
      p_Var21 = (_func_int *)0xf;
      if (local_ca8 != &local_c98) {
        p_Var21 = local_c98;
      }
      if (p_Var21 < (_func_int *)(local_c08 + local_ca0)) {
        p_Var21 = (_func_int *)0xf;
        if (local_c10 != local_c00) {
          p_Var21 = local_c00[0];
        }
        if (p_Var21 < (_func_int *)(local_c08 + local_ca0)) goto LAB_00119eaf;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_c10,0,(char *)0x0,(ulong)local_ca8);
      }
      else {
LAB_00119eaf:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ca8,(ulong)local_c10)
        ;
      }
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_cf8 = *pp_Var18;
        uStack_cf0 = puVar13[3];
        local_d08 = &local_cf8;
      }
      else {
        local_cf8 = *pp_Var18;
        local_d08 = (_func_int **)*puVar13;
      }
      local_d00 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)pp_Var18 = 0;
      local_bc0 = local_bb0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc0,".quadratic","");
      p_Var21 = (_func_int *)0xf;
      if (local_d08 != &local_cf8) {
        p_Var21 = local_cf8;
      }
      if (p_Var21 < (_func_int *)(local_bb8 + local_d00)) {
        p_Var21 = (_func_int *)0xf;
        if (local_bc0 != local_bb0) {
          p_Var21 = local_bb0[0];
        }
        if (p_Var21 < (_func_int *)(local_bb8 + local_d00)) goto LAB_00119f85;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_bc0,0,(char *)0x0,(ulong)local_d08);
      }
      else {
LAB_00119f85:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d08,(ulong)local_bc0)
        ;
      }
      pp_Var18 = (_func_int **)(puVar13 + 2);
      if ((_func_int **)*puVar13 == pp_Var18) {
        local_cd8 = *pp_Var18;
        uStack_cd0 = puVar13[3];
        local_ce8 = &local_cd8;
      }
      else {
        local_cd8 = *pp_Var18;
        local_ce8 = (_func_int **)*puVar13;
      }
      local_ce0 = puVar13[1];
      *puVar13 = pp_Var18;
      puVar13[1] = 0;
      *(undefined1 *)pp_Var18 = 0;
      std::ofstream::ofstream(local_af8,(char *)local_ce8,_S_out);
      if (local_ce8 != &local_cd8) {
        operator_delete(local_ce8);
      }
      if (local_bc0 != local_bb0) {
        operator_delete(local_bc0);
      }
      if (local_d08 != &local_cf8) {
        operator_delete(local_d08);
      }
      if (local_c10 != local_c00) {
        operator_delete(local_c10);
      }
      iVar7 = (int)local_c40;
      if (local_ca8 != &local_c98) {
        operator_delete(local_ca8);
      }
      if (local_c38 != local_c28) {
        operator_delete(local_c38);
      }
      uVar20 = (ulong)iVar7;
      peVar16 = (example *)0x0;
      local_bc8 = (ulong)bVar1 * 0x68;
      local_c40 = (long)local_c68 * 0x68;
      while( true ) {
        _Var14 = getline(&local_c18,&local_ba0,local_bd0);
        pcVar8 = local_c18;
        if (_Var14 == -1) break;
        sVar15 = strlen(local_c18);
        pcVar8[sVar15 - 1] = '\0';
        peVar16 = VW::read_example(all,local_c18);
        lVar11 = local_bc8;
        plVar12 = (long *)((long)&(peVar16->super_example_predict).feature_space[0].values._begin +
                          local_bc8);
        local_c68 = peVar16;
        if (*(long *)((long)&(peVar16->super_example_predict).feature_space[0].values._end +
                     local_bc8) !=
            *(long *)((long)&(peVar16->super_example_predict).feature_space[0].values._begin +
                     local_bc8)) {
          uVar22 = 0;
          do {
            lVar3 = *(long *)(*(long *)((long)&(peVar16->super_example_predict).feature_space[0].
                                               space_names._begin + lVar11) + uVar22 * 0x10);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_430,*(char **)(lVar3 + 0x20),
                                 *(long *)(lVar3 + 0x28));
            local_ce8 = (_func_int **)CONCAT71(local_ce8._1_7_,9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&local_ce8,1);
            std::ostream::_M_insert<double>
                      ((double)(all->weights).dense_weights._begin
                               [(all->weights).dense_weights._weight_mask &
                                *(ulong *)(*(long *)((long)&(peVar16->super_example_predict).
                                                            feature_space[0].indicies._begin +
                                                    lVar11) + uVar22 * 8)]);
            lVar3 = *(long *)(*(long *)((long)&(peVar16->super_example_predict).feature_space[0].
                                               space_names._begin + lVar11) + uVar22 * 0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6d0,*(char **)(lVar3 + 0x20),*(long *)(lVar3 + 0x28));
            if (iVar7 != 0) {
              uVar19 = 1;
              do {
                local_ce8 = (_func_int **)CONCAT71(local_ce8._1_7_,9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_6d0,(char *)&local_ce8,1);
                std::ostream::_M_insert<double>
                          ((double)(all->weights).dense_weights._begin
                                   [*(long *)(*(long *)((long)&(peVar16->super_example_predict).
                                                               feature_space[0].indicies._begin +
                                                       lVar11) + uVar22 * 8) + uVar19 &
                                    (all->weights).dense_weights._weight_mask]);
                uVar19 = uVar19 + 1;
              } while (uVar19 <= uVar20);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)(*(long *)((long)&(peVar16->super_example_predict).feature_space
                                                     [0].values._end + lVar11) - *plVar12 >> 2));
        }
        std::ios::widen((char)*(_func_int **)(local_430._0_8_ + -0x18) + (char)local_430);
        std::ostream::put((char)local_430);
        std::ostream::flush();
        std::ios::widen((char)*(_func_int **)((long)local_6d0 + -0x18) + (char)local_6d0);
        std::ostream::put((char)local_6d0);
        std::ostream::flush();
        if (*(long *)((long)&(local_c68->super_example_predict).feature_space[0].values._end +
                     local_c40) !=
            *(long *)((long)&(local_c68->super_example_predict).feature_space[0].values._begin +
                     local_c40)) {
          plVar12 = (long *)((long)&(local_c68->super_example_predict).feature_space[0].values.
                                    _begin + local_c40);
          uVar22 = 0;
          do {
            lVar3 = *(long *)(plVar12[8] + uVar22 * 0x10);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_8d0,*(char **)(lVar3 + 0x20),
                                 *(long *)(lVar3 + 0x28));
            local_ce8 = (_func_int **)CONCAT71(local_ce8._1_7_,9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&local_ce8,1);
            std::ostream::_M_insert<double>
                      ((double)(all->weights).dense_weights._begin
                               [(all->weights).dense_weights._weight_mask &
                                *(ulong *)(*(long *)((long)&(peVar16->super_example_predict).
                                                            feature_space[0].indicies._begin +
                                                    lVar11) + uVar22 * 8)]);
            lVar3 = *(long *)(plVar12[8] + uVar22 * 0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_af8,*(char **)(lVar3 + 0x20),*(long *)(lVar3 + 0x28));
            if (iVar7 != 0) {
              uVar19 = 1;
              do {
                local_ce8 = (_func_int **)CONCAT71(local_ce8._1_7_,9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_af8,(char *)&local_ce8,1);
                std::ostream::_M_insert<double>
                          ((double)(all->weights).dense_weights._begin
                                   [uVar19 + uVar20 +
                                    *(long *)(*(long *)((long)&(peVar16->super_example_predict).
                                                               feature_space[0].indicies._begin +
                                                       lVar11) + uVar22 * 8) &
                                    (all->weights).dense_weights._weight_mask]);
                uVar19 = uVar19 + 1;
              } while (uVar19 <= uVar20);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)(plVar12[1] - *plVar12 >> 2));
        }
        std::ios::widen((char)*(_func_int **)((long)local_8d0 + -0x18) + (char)local_8d0);
        peVar16 = local_c68;
        std::ostream::put((char)local_8d0);
        std::ostream::flush();
        std::ios::widen((char)*(_func_int **)((long)local_af8 + -0x18) + (char)local_af8);
        std::ostream::put((char)local_af8);
        std::ostream::flush();
        VW::finish_example(all,peVar16);
      }
      poVar17 = std::ostream::_M_insert<double>
                          ((double)(all->weights).dense_weights._begin
                                   [(all->weights).dense_weights._weight_mask &
                                    *(peVar16->super_example_predict).feature_space[0x80].indicies.
                                     _begin]);
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      VW::finish(all,true);
      fclose(local_bd0);
      uVar5 = _pthread_mutex_unlock;
      pbVar4 = _VTT;
      local_af8 = (undefined1  [8])_VTT;
      *(undefined8 *)
       (local_af8 +
       (long)_VTT[-1].original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) = _pthread_mutex_unlock;
      std::filebuf::~filebuf((filebuf *)&local_af0);
      std::ios_base::~ios_base(aiStack_a00);
      local_8d0 = (undefined1  [8])pbVar4;
      *(undefined8 *)
       (local_8d0 +
       (long)pbVar4[-1].original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) = uVar5;
      std::filebuf::~filebuf((filebuf *)&local_8c8);
      std::ios_base::~ios_base(aiStack_7d8);
      local_6d0 = (undefined1  [8])pbVar4;
      *(undefined8 *)
       (local_6d0 +
       (long)pbVar4[-1].original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) = uVar5;
      std::filebuf::~filebuf((filebuf *)&local_6c8);
      std::ios_base::~ios_base(aiStack_5d8);
      local_430._0_8_ = pbVar4;
      *(undefined8 *)
       (local_430 +
       (long)pbVar4[-1].original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) = uVar5;
      std::filebuf::~filebuf((filebuf *)(local_430 + 8));
      std::ios_base::~ios_base(aiStack_338);
      local_230._0_8_ = pbVar4;
      *(undefined8 *)
       (local_230 +
       (long)pbVar4[-1].original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) = uVar5;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(aiStack_138);
      if (local_c60 != local_c50) {
        operator_delete(local_c60);
      }
      iVar7 = 0;
      goto LAB_0011a5b5;
    }
  }
  else if ((basic_option<char> *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dumps weights for matrix factorization model (gd_mf).",0x35);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The constant will be written to <outdir>/constant.",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Linear and quadratic weights corresponding to the input features will be ",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "written to <outdir>/<ns>.linear and <outdir>/<ns>.quadratic,respectively.",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  poVar17 = (ostream *)
            boost::program_options::operator<<
                      ((ostream *)&std::cout,(options_description *)local_b78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Example usage:",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    Extract weights for user 42 and item 7 under randomly initialized rank 10 model:",
             0x54);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    echo \'|u 42 |i 7\' | ./gd_mf_weights -I /dev/stdin --vwparams \'-q ui --rank 10\'"
             ,0x52);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  iVar7 = 1;
  std::ostream::flush();
LAB_0011a5b5:
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_b10);
  if (local_b38 != (void *)0x0) {
    operator_delete(local_b38);
    local_b38 = (void *)0x0;
    local_b30 = 0;
    local_b28 = 0;
    local_b20 = 0;
    local_b18 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_b50);
  if (local_b78[0] != local_b68) {
    operator_delete(local_b78[0]);
  }
  local_4d0[0] = std::__cxx11::istringstream::istringstream;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_460);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_490);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
    operator_delete(local_cc8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
    operator_delete(local_bf0._M_dataplus._M_p);
  }
  return iVar7;
}

Assistant:

int main(int argc, char *argv[])
{ string infile;
  string outdir(".");
  string vwparams;

  po::variables_map vm;
  po::options_description desc("Allowed options");
  desc.add_options()
  ("help,h", "produce help message")
  ("infile,I", po::value<string>(&infile), "input (in vw format) of weights to extract")
  ("outdir,O", po::value<string>(&outdir), "directory to write model files to (default: .)")
  ("vwparams", po::value<string>(&vwparams), "vw parameters for model instantiation (-i model.reg -t ...")
  ;

  try
  { po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);
  }
  catch(exception & e)
  { cout << endl << argv[0] << ": " << e.what() << endl << endl << desc << endl;
    exit(2);
  }

  if (vm.count("help") || infile.empty() || vwparams.empty())
  { cout << "Dumps weights for matrix factorization model (gd_mf)." << endl;
    cout << "The constant will be written to <outdir>/constant." << endl;
    cout << "Linear and quadratic weights corresponding to the input features will be " << endl;
    cout << "written to <outdir>/<ns>.linear and <outdir>/<ns>.quadratic,respectively." << endl;
    cout << endl;
    cout << desc << "\n";
    cout << "Example usage:" << endl;
    cout << "    Extract weights for user 42 and item 7 under randomly initialized rank 10 model:" << endl;
    cout << "    echo '|u 42 |i 7' | ./gd_mf_weights -I /dev/stdin --vwparams '-q ui --rank 10'" << endl;
    return 1;
  }

  // initialize model
  vw* model = VW::initialize(vwparams);
  model->audit = true;

  string target("--rank ");
  size_t loc = vwparams.find(target);
  const char* location = vwparams.c_str()+loc+target.size();
  size_t rank = atoi(location);

  // global model params
  unsigned char left_ns = model->pairs[0][0];
  unsigned char right_ns = model->pairs[0][1];
  dense_parameters& weights = model->weights.dense_weights;

  // const char *filename = argv[0];
  FILE* file = fopen(infile.c_str(), "r");
  char* line = NULL;
  size_t len = 0;
  ssize_t read;

  // output files
  ofstream constant((outdir + string("/") + string("constant")).c_str()),
           left_linear((outdir + string("/") + string(1, left_ns) + string(".linear")).c_str()),
           left_quadratic((outdir + string("/") + string(1, left_ns) + string(".quadratic")).c_str()),
           right_linear((outdir + string("/") + string(1, right_ns) + string(".linear")).c_str()),
           right_quadratic((outdir + string("/") + string(1, right_ns) + string(".quadratic")).c_str());

  example *ec = NULL;
  while ((read = getline(&line, &len, file)) != -1)
  { line[strlen(line)-1] = 0; // chop

    ec = VW::read_example(*model, line);

    // write out features for left namespace
    features& left = ec->feature_space[left_ns];
    for (size_t i = 0; i < left.size(); ++i)
    { left_linear << left.space_names[i].get()->second << '\t' << weights[left.indicies[i]];

      left_quadratic << left.space_names[i].get()->second;
      for (size_t k = 1; k <= rank; k++)
        left_quadratic << '\t' << weights[(left.indicies[i] + k)];
    }
    left_linear << endl;
    left_quadratic << endl;

    // write out features for right namespace
    features& right = ec->feature_space[right_ns];
    for (size_t i = 0; i < right.size(); ++i)
    { right_linear << right.space_names[i].get()->second << '\t' << weights[left.indicies[i]];

      right_quadratic << right.space_names[i].get()->second;
      for (size_t k = 1; k <= rank; k++)
        right_quadratic << '\t' << weights[(left.indicies[i] + k + rank)];
    }
    right_linear << endl;
    right_quadratic << endl;

    VW::finish_example(*model, *ec);
  }

  // write constant
  constant << weights[ec->feature_space[constant_namespace].indicies[0]] << endl;

  // clean up
  VW::finish(*model);
  fclose(file);
}